

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O1

void to_vector(string *s,string *sep,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *l)

{
  pointer pcVar1;
  ulong uVar2;
  string _s;
  string sub_str;
  value_type local_90;
  value_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar1,pcVar1 + s->_M_string_length)
  ;
  if (local_90._M_string_length == 0) {
LAB_00105fb0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,anon_var_dwarf_36d8 + 0xc);
  uVar2 = std::__cxx11::string::find((char *)s,(ulong)(sep->_M_dataplus)._M_p,0);
LAB_00105ed6:
  if (uVar2 != 0) {
    if (uVar2 == 0xffffffffffffffff) {
      if (local_90._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(l,&local_90);
      }
LAB_00105f94:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00105fb0;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(l,&local_70);
  }
  if (local_90._M_string_length <= uVar2) goto LAB_00105f94;
  std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
  std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  uVar2 = std::__cxx11::string::find((char *)&local_90,(ulong)(sep->_M_dataplus)._M_p,0);
  goto LAB_00105ed6;
}

Assistant:

void to_vector(
    const std::string &s, const std::string &sep, std::vector<std::string> &l) {
    std::string _s(s);

  if ( _s.empty() ) return;

  size_t found;
  std::string sub_str = "";

  found = s.find(sep);

  while (found != std::string::npos) {
    /*跳过空值，比如abcd,123456,,8909
     * * 按照逗号分隔，会有空值,found=0*/
    if (found > 0) {
      sub_str = _s.substr(0, found);
      l.push_back(sub_str);
    }

    if (found >= _s.size()) return;

    _s = _s.substr(found + sep.size());
    found = _s.find(sep);
  }

  if (_s.length() > 0) l.push_back(_s);
}